

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_new(REF_AGENTS ref_agents,REF_INT *id)

{
  uint uVar1;
  int iVar2;
  REF_AGENT_STRUCT *__ptr;
  int iVar3;
  REF_INT *pRVar4;
  long lVar5;
  int iVar6;
  
  iVar6 = ref_agents->blank;
  if (iVar6 == -1) {
    iVar6 = ref_agents->max;
    iVar3 = 5000;
    if (5000 < (int)((double)iVar6 * 1.5)) {
      iVar3 = (int)((double)iVar6 * 1.5);
    }
    ref_agents->max = iVar3 + iVar6;
    fflush(_stdout);
    __ptr = ref_agents->agent;
    if (0 < (long)ref_agents->max) {
      __ptr = (REF_AGENT_STRUCT *)realloc(__ptr,(long)ref_agents->max * 0x68);
      ref_agents->agent = __ptr;
    }
    if (__ptr == (REF_AGENT_STRUCT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",0x7b
             ,"ref_agents_new","realloc ref_agents->agent NULL");
      uVar1 = ref_agents->max;
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar1,
             (long)(int)uVar1,0x68,(long)(int)uVar1 * 0x68);
      return 2;
    }
    iVar3 = ref_agents->max;
    if (iVar6 < iVar3) {
      pRVar4 = &__ptr[iVar6].next;
      lVar5 = (long)iVar3 - (long)iVar6;
      iVar2 = iVar6;
      do {
        iVar2 = iVar2 + 1;
        ((REF_AGENT_STRUCT *)(pRVar4 + -2))->mode = REF_AGENT_UNUSED;
        ((REF_AGENT_STRUCT *)(pRVar4 + -2))->previous = -1;
        *pRVar4 = iVar2;
        pRVar4 = pRVar4 + 0x1a;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    __ptr[(long)iVar3 + -1].next = -1;
  }
  else {
    __ptr = ref_agents->agent;
  }
  *id = iVar6;
  ref_agents->blank = __ptr[iVar6].next;
  iVar6 = ref_agents->last;
  iVar3 = *id;
  if ((long)iVar6 != -1) {
    __ptr[iVar6].next = iVar3;
  }
  __ptr[iVar3].mode = REF_AGENT_NEW;
  __ptr[*id].previous = iVar6;
  __ptr[*id].next = -1;
  ref_agents->last = *id;
  ref_agents->n = ref_agents->n + 1;
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_agents_new(REF_AGENTS ref_agents, REF_INT *id) {
  if (REF_EMPTY == ref_agents->blank) {
    REF_INT orig, chunk, extra;
    orig = ref_agents->max;
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_agents->max = orig + chunk;
    ref_realloc(ref_agents->agent, ref_agents->max, REF_AGENT_STRUCT);

    for (extra = orig; extra < ref_agents->max; extra++) {
      ref_agent_mode(ref_agents, extra) = REF_AGENT_UNUSED;
      ref_agent_previous(ref_agents, extra) = REF_EMPTY;
      ref_agent_next(ref_agents, extra) = extra + 1;
    }
    ref_agent_next(ref_agents, ref_agents_max(ref_agents) - 1) = REF_EMPTY;
    ref_agents->blank = orig;
  }

  *id = ref_agents->blank;
  ref_agents->blank = ref_agent_next(ref_agents, *id);

  if (REF_EMPTY != ref_agents->last)
    ref_agent_next(ref_agents, ref_agents->last) = *id;

  ref_agent_mode(ref_agents, *id) = REF_AGENT_NEW;
  ref_agent_previous(ref_agents, *id) = ref_agents->last;
  ref_agent_next(ref_agents, *id) = REF_EMPTY;

  ref_agents->last = *id;

  ref_agents_n(ref_agents)++;

  return REF_SUCCESS;
}